

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O0

void __thiscall r_code::Code::load(Code *this,SysObject *source)

{
  int iVar1;
  size_t sVar2;
  Atom *pAVar3;
  undefined4 extraout_var;
  undefined8 extraout_RDX;
  ushort local_1a;
  uint16_t i;
  SysObject *source_local;
  Code *this_local;
  
  local_1a = 0;
  while( true ) {
    sVar2 = vector<r_code::Atom>::size((vector<r_code::Atom> *)(source + 8));
    if (sVar2 <= local_1a) break;
    pAVar3 = vector<r_code::Atom>::operator[]((vector<r_code::Atom> *)(source + 8),(ulong)local_1a);
    iVar1 = (*(this->super__Object)._vptr__Object[4])
                      (this,(ulong)local_1a,extraout_RDX,CONCAT62((int6)(sVar2 >> 0x10),local_1a));
    r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar1),pAVar3);
    local_1a = local_1a + 1;
  }
  (*(this->super__Object)._vptr__Object[3])(this,(ulong)*(uint *)(source + 0x68));
  return;
}

Assistant:

void load(SysObject *source)
    {
        for (uint16_t i = 0; i < source->code.size(); ++i) {
            code(i) = source->code[i];
        }

        set_oid(source->oid);
    }